

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Maybe<capnp::compiler::CompilerMain::Format> __thiscall
capnp::compiler::CompilerMain::parseFormatName(CompilerMain *this,StringPtr name)

{
  int iVar1;
  size_t in_RCX;
  void *__s1;
  
  __s1 = (void *)name.content.size_;
  switch(in_RCX - 5) {
  case 0:
switchD_0011d9b1_caseD_0:
    iVar1 = bcmp(__s1,"flat",in_RCX);
    if (iVar1 == 0) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 2;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    if (in_RCX == 5) goto LAB_0011da90;
    if (in_RCX != 10) {
      if (in_RCX != 0xc) goto switchD_0011d9b1_caseD_1;
      goto switchD_0011d9b1_caseD_7;
    }
    break;
  default:
    goto switchD_0011d9b1_caseD_1;
  case 2:
    iVar1 = bcmp(__s1,"binary",in_RCX);
    if (iVar1 == 0) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 0;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    switch(in_RCX - 5) {
    case 0:
      goto switchD_0011d9b1_caseD_0;
    default:
      goto switchD_0011d9b1_caseD_1;
    case 2:
      iVar1 = bcmp(__s1,"packed",in_RCX);
      if (iVar1 == 0) {
        *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
        *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 1;
        return (Maybe<capnp::compiler::CompilerMain::Format>)
               (NullableValue<capnp::compiler::CompilerMain::Format>)this;
      }
      if (in_RCX == 0xc) goto switchD_0011d9b1_caseD_7;
      if (in_RCX != 10) {
        if (in_RCX != 5) goto switchD_0011d9b1_caseD_1;
        goto switchD_0011d9b1_caseD_0;
      }
      break;
    case 5:
      break;
    case 7:
      goto switchD_0011d9b1_caseD_7;
    }
    break;
  case 5:
    break;
  case 7:
switchD_0011d9b1_caseD_7:
    iVar1 = bcmp(__s1,"flat-packed",in_RCX);
    if (iVar1 == 0) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 3;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    if (in_RCX != 5) {
      if (in_RCX != 10) goto switchD_0011d9b1_caseD_1;
      break;
    }
    goto LAB_0011da90;
  }
  iVar1 = bcmp(__s1,"canonical",in_RCX);
  if (iVar1 == 0) {
    *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
    *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 4;
    return (Maybe<capnp::compiler::CompilerMain::Format>)
           (NullableValue<capnp::compiler::CompilerMain::Format>)this;
  }
  if (in_RCX == 5) {
LAB_0011da90:
    iVar1 = bcmp(__s1,"text",in_RCX);
    if (iVar1 == 0) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 5;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    if ((in_RCX == 5) && (iVar1 = bcmp(__s1,"json",5), iVar1 == 0)) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 6;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
  }
switchD_0011d9b1_caseD_1:
  *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 0;
  return (Maybe<capnp::compiler::CompilerMain::Format>)
         (NullableValue<capnp::compiler::CompilerMain::Format>)this;
}

Assistant:

kj::Maybe<Format> parseFormatName(kj::StringPtr name) {
    if (name == "binary"     ) return Format::BINARY;
    if (name == "packed"     ) return Format::PACKED;
    if (name == "flat"       ) return Format::FLAT;
    if (name == "flat-packed") return Format::FLAT_PACKED;
    if (name == "canonical"  ) return Format::CANONICAL;
    if (name == "text"       ) return Format::TEXT;
    if (name == "json"       ) return Format::JSON;

    return kj::none;
  }